

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall google::protobuf::Descriptor::CopyTo(Descriptor *this,DescriptorProto *proto)

{
  int iVar1;
  int32 iVar2;
  uint uVar3;
  string *initial_value;
  string *psVar4;
  long lVar5;
  OneofDescriptorProto *proto_00;
  DescriptorProto *proto_01;
  EnumDescriptorProto *proto_02;
  DescriptorProto_ExtensionRange *proto_03;
  FieldDescriptorProto *pFVar6;
  Rep *pRVar7;
  DescriptorProto_ReservedRange *pDVar8;
  MessageOptions *pMVar9;
  MessageOptions *pMVar10;
  long lVar11;
  int iVar12;
  Arena *pAVar13;
  long lVar14;
  
  initial_value = *(string **)this;
  (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 1;
  pAVar13 = (Arena *)(proto->_internal_metadata_).
                     super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                     .ptr_;
  if (((ulong)pAVar13 & 1) != 0) {
    pAVar13 = *(Arena **)(((ulong)pAVar13 & 0xfffffffffffffffe) + 0x18);
  }
  psVar4 = (proto->name_).ptr_;
  if (psVar4 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstance(&proto->name_,pAVar13,initial_value);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar4);
  }
  if (0 < *(int *)(this + 0x68)) {
    lVar14 = 0;
    lVar11 = 0;
    do {
      lVar5 = *(long *)(this + 0x28);
      pRVar7 = (proto->field_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar7 == (Rep *)0x0) {
        iVar12 = (proto->field_).super_RepeatedPtrFieldBase.total_size_;
LAB_002c9f00:
        internal::RepeatedPtrFieldBase::Reserve
                  (&(proto->field_).super_RepeatedPtrFieldBase,iVar12 + 1);
        pRVar7 = (proto->field_).super_RepeatedPtrFieldBase.rep_;
        iVar12 = pRVar7->allocated_size;
LAB_002c9f10:
        pRVar7->allocated_size = iVar12 + 1;
        pFVar6 = Arena::CreateMaybeMessage<google::protobuf::FieldDescriptorProto>
                           ((proto->field_).super_RepeatedPtrFieldBase.arena_);
        pRVar7 = (proto->field_).super_RepeatedPtrFieldBase.rep_;
        iVar12 = (proto->field_).super_RepeatedPtrFieldBase.current_size_;
        (proto->field_).super_RepeatedPtrFieldBase.current_size_ = iVar12 + 1;
        pRVar7->elements[iVar12] = pFVar6;
      }
      else {
        iVar1 = (proto->field_).super_RepeatedPtrFieldBase.current_size_;
        iVar12 = pRVar7->allocated_size;
        if (iVar12 <= iVar1) {
          if (iVar12 == (proto->field_).super_RepeatedPtrFieldBase.total_size_) goto LAB_002c9f00;
          goto LAB_002c9f10;
        }
        (proto->field_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        pFVar6 = (FieldDescriptorProto *)pRVar7->elements[iVar1];
      }
      FieldDescriptor::CopyTo((FieldDescriptor *)(lVar5 + lVar14),pFVar6);
      lVar11 = lVar11 + 1;
      lVar14 = lVar14 + 0x98;
    } while (lVar11 < *(int *)(this + 0x68));
  }
  if (0 < *(int *)(this + 0x6c)) {
    lVar14 = 0;
    lVar11 = 0;
    do {
      lVar5 = *(long *)(this + 0x30);
      pRVar7 = (proto->oneof_decl_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar7 == (Rep *)0x0) {
        iVar12 = (proto->oneof_decl_).super_RepeatedPtrFieldBase.total_size_;
LAB_002c9fac:
        internal::RepeatedPtrFieldBase::Reserve
                  (&(proto->oneof_decl_).super_RepeatedPtrFieldBase,iVar12 + 1);
        pRVar7 = (proto->oneof_decl_).super_RepeatedPtrFieldBase.rep_;
        iVar12 = pRVar7->allocated_size;
LAB_002c9fbf:
        pRVar7->allocated_size = iVar12 + 1;
        proto_00 = Arena::CreateMaybeMessage<google::protobuf::OneofDescriptorProto>
                             ((proto->oneof_decl_).super_RepeatedPtrFieldBase.arena_);
        pRVar7 = (proto->oneof_decl_).super_RepeatedPtrFieldBase.rep_;
        iVar12 = (proto->oneof_decl_).super_RepeatedPtrFieldBase.current_size_;
        (proto->oneof_decl_).super_RepeatedPtrFieldBase.current_size_ = iVar12 + 1;
        pRVar7->elements[iVar12] = proto_00;
      }
      else {
        iVar1 = (proto->oneof_decl_).super_RepeatedPtrFieldBase.current_size_;
        iVar12 = pRVar7->allocated_size;
        if (iVar12 <= iVar1) {
          if (iVar12 == (proto->oneof_decl_).super_RepeatedPtrFieldBase.total_size_)
          goto LAB_002c9fac;
          goto LAB_002c9fbf;
        }
        (proto->oneof_decl_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        proto_00 = (OneofDescriptorProto *)pRVar7->elements[iVar1];
      }
      OneofDescriptor::CopyTo((OneofDescriptor *)(lVar5 + lVar14),proto_00);
      lVar11 = lVar11 + 1;
      lVar14 = lVar14 + 0x30;
    } while (lVar11 < *(int *)(this + 0x6c));
  }
  if (0 < *(int *)(this + 0x70)) {
    lVar14 = 0;
    lVar11 = 0;
    do {
      lVar5 = *(long *)(this + 0x38);
      pRVar7 = (proto->nested_type_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar7 == (Rep *)0x0) {
        iVar12 = (proto->nested_type_).super_RepeatedPtrFieldBase.total_size_;
LAB_002ca052:
        internal::RepeatedPtrFieldBase::Reserve
                  (&(proto->nested_type_).super_RepeatedPtrFieldBase,iVar12 + 1);
        pRVar7 = (proto->nested_type_).super_RepeatedPtrFieldBase.rep_;
        iVar12 = pRVar7->allocated_size;
LAB_002ca062:
        pRVar7->allocated_size = iVar12 + 1;
        proto_01 = Arena::CreateMaybeMessage<google::protobuf::DescriptorProto>
                             ((proto->nested_type_).super_RepeatedPtrFieldBase.arena_);
        pRVar7 = (proto->nested_type_).super_RepeatedPtrFieldBase.rep_;
        iVar12 = (proto->nested_type_).super_RepeatedPtrFieldBase.current_size_;
        (proto->nested_type_).super_RepeatedPtrFieldBase.current_size_ = iVar12 + 1;
        pRVar7->elements[iVar12] = proto_01;
      }
      else {
        iVar1 = (proto->nested_type_).super_RepeatedPtrFieldBase.current_size_;
        iVar12 = pRVar7->allocated_size;
        if (iVar12 <= iVar1) {
          if (iVar12 == (proto->nested_type_).super_RepeatedPtrFieldBase.total_size_)
          goto LAB_002ca052;
          goto LAB_002ca062;
        }
        (proto->nested_type_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        proto_01 = (DescriptorProto *)pRVar7->elements[iVar1];
      }
      CopyTo((Descriptor *)(lVar5 + lVar14),proto_01);
      lVar11 = lVar11 + 1;
      lVar14 = lVar14 + 0x90;
    } while (lVar11 < *(int *)(this + 0x70));
  }
  if (0 < *(int *)(this + 0x74)) {
    lVar14 = 0;
    lVar11 = 0;
    do {
      lVar5 = *(long *)(this + 0x40);
      pRVar7 = (proto->enum_type_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar7 == (Rep *)0x0) {
        iVar12 = (proto->enum_type_).super_RepeatedPtrFieldBase.total_size_;
LAB_002ca0ec:
        internal::RepeatedPtrFieldBase::Reserve
                  (&(proto->enum_type_).super_RepeatedPtrFieldBase,iVar12 + 1);
        pRVar7 = (proto->enum_type_).super_RepeatedPtrFieldBase.rep_;
        iVar12 = pRVar7->allocated_size;
LAB_002ca0fc:
        pRVar7->allocated_size = iVar12 + 1;
        proto_02 = Arena::CreateMaybeMessage<google::protobuf::EnumDescriptorProto>
                             ((proto->enum_type_).super_RepeatedPtrFieldBase.arena_);
        pRVar7 = (proto->enum_type_).super_RepeatedPtrFieldBase.rep_;
        iVar12 = (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_;
        (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar12 + 1;
        pRVar7->elements[iVar12] = proto_02;
      }
      else {
        iVar1 = (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_;
        iVar12 = pRVar7->allocated_size;
        if (iVar12 <= iVar1) {
          if (iVar12 == (proto->enum_type_).super_RepeatedPtrFieldBase.total_size_)
          goto LAB_002ca0ec;
          goto LAB_002ca0fc;
        }
        (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        proto_02 = (EnumDescriptorProto *)pRVar7->elements[iVar1];
      }
      EnumDescriptor::CopyTo((EnumDescriptor *)(lVar5 + lVar14),proto_02);
      lVar11 = lVar11 + 1;
      lVar14 = lVar14 + 0x50;
    } while (lVar11 < *(int *)(this + 0x74));
  }
  if (0 < *(int *)(this + 0x78)) {
    lVar14 = 0;
    lVar11 = 0;
    do {
      lVar5 = *(long *)(this + 0x48);
      pRVar7 = (proto->extension_range_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar7 == (Rep *)0x0) {
        iVar12 = (proto->extension_range_).super_RepeatedPtrFieldBase.total_size_;
LAB_002ca17f:
        internal::RepeatedPtrFieldBase::Reserve
                  (&(proto->extension_range_).super_RepeatedPtrFieldBase,iVar12 + 1);
        pRVar7 = (proto->extension_range_).super_RepeatedPtrFieldBase.rep_;
        iVar12 = pRVar7->allocated_size;
LAB_002ca18f:
        pRVar7->allocated_size = iVar12 + 1;
        proto_03 = Arena::CreateMaybeMessage<google::protobuf::DescriptorProto_ExtensionRange>
                             ((proto->extension_range_).super_RepeatedPtrFieldBase.arena_);
        pRVar7 = (proto->extension_range_).super_RepeatedPtrFieldBase.rep_;
        iVar12 = (proto->extension_range_).super_RepeatedPtrFieldBase.current_size_;
        (proto->extension_range_).super_RepeatedPtrFieldBase.current_size_ = iVar12 + 1;
        pRVar7->elements[iVar12] = proto_03;
      }
      else {
        iVar1 = (proto->extension_range_).super_RepeatedPtrFieldBase.current_size_;
        iVar12 = pRVar7->allocated_size;
        if (iVar12 <= iVar1) {
          if (iVar12 == (proto->extension_range_).super_RepeatedPtrFieldBase.total_size_)
          goto LAB_002ca17f;
          goto LAB_002ca18f;
        }
        (proto->extension_range_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        proto_03 = (DescriptorProto_ExtensionRange *)pRVar7->elements[iVar1];
      }
      ExtensionRange::CopyTo((ExtensionRange *)(lVar5 + lVar14),proto_03);
      lVar11 = lVar11 + 1;
      lVar14 = lVar14 + 0x10;
    } while (lVar11 < *(int *)(this + 0x78));
  }
  if (0 < *(int *)(this + 0x7c)) {
    lVar14 = 0;
    lVar11 = 0;
    do {
      lVar5 = *(long *)(this + 0x50);
      pRVar7 = (proto->extension_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar7 == (Rep *)0x0) {
        iVar12 = (proto->extension_).super_RepeatedPtrFieldBase.total_size_;
LAB_002ca221:
        internal::RepeatedPtrFieldBase::Reserve
                  (&(proto->extension_).super_RepeatedPtrFieldBase,iVar12 + 1);
        pRVar7 = (proto->extension_).super_RepeatedPtrFieldBase.rep_;
        iVar12 = pRVar7->allocated_size;
LAB_002ca234:
        pRVar7->allocated_size = iVar12 + 1;
        pFVar6 = Arena::CreateMaybeMessage<google::protobuf::FieldDescriptorProto>
                           ((proto->extension_).super_RepeatedPtrFieldBase.arena_);
        pRVar7 = (proto->extension_).super_RepeatedPtrFieldBase.rep_;
        iVar12 = (proto->extension_).super_RepeatedPtrFieldBase.current_size_;
        (proto->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar12 + 1;
        pRVar7->elements[iVar12] = pFVar6;
      }
      else {
        iVar1 = (proto->extension_).super_RepeatedPtrFieldBase.current_size_;
        iVar12 = pRVar7->allocated_size;
        if (iVar12 <= iVar1) {
          if (iVar12 == (proto->extension_).super_RepeatedPtrFieldBase.total_size_)
          goto LAB_002ca221;
          goto LAB_002ca234;
        }
        (proto->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        pFVar6 = (FieldDescriptorProto *)pRVar7->elements[iVar1];
      }
      FieldDescriptor::CopyTo((FieldDescriptor *)(lVar5 + lVar14),pFVar6);
      lVar11 = lVar11 + 1;
      lVar14 = lVar14 + 0x98;
    } while (lVar11 < *(int *)(this + 0x7c));
  }
  if (0 < *(int *)(this + 0x80)) {
    lVar11 = 0;
    do {
      pRVar7 = (proto->reserved_range_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar7 == (Rep *)0x0) {
        iVar12 = (proto->reserved_range_).super_RepeatedPtrFieldBase.total_size_;
LAB_002ca2d3:
        internal::RepeatedPtrFieldBase::Reserve
                  (&(proto->reserved_range_).super_RepeatedPtrFieldBase,iVar12 + 1);
        pRVar7 = (proto->reserved_range_).super_RepeatedPtrFieldBase.rep_;
        iVar12 = pRVar7->allocated_size;
LAB_002ca2e6:
        pRVar7->allocated_size = iVar12 + 1;
        pDVar8 = Arena::CreateMaybeMessage<google::protobuf::DescriptorProto_ReservedRange>
                           ((proto->reserved_range_).super_RepeatedPtrFieldBase.arena_);
        pRVar7 = (proto->reserved_range_).super_RepeatedPtrFieldBase.rep_;
        iVar12 = (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
        (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = iVar12 + 1;
        pRVar7->elements[iVar12] = pDVar8;
      }
      else {
        iVar1 = (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
        iVar12 = pRVar7->allocated_size;
        if (iVar12 <= iVar1) {
          if (iVar12 == (proto->reserved_range_).super_RepeatedPtrFieldBase.total_size_)
          goto LAB_002ca2d3;
          goto LAB_002ca2e6;
        }
        (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        pDVar8 = (DescriptorProto_ReservedRange *)pRVar7->elements[iVar1];
      }
      lVar14 = *(long *)(this + 0x58);
      iVar2 = *(int32 *)(lVar14 + lVar11 * 8);
      uVar3 = (pDVar8->_has_bits_).has_bits_[0];
      (pDVar8->_has_bits_).has_bits_[0] = uVar3 | 1;
      pDVar8->start_ = iVar2;
      iVar2 = *(int32 *)(lVar14 + 4 + lVar11 * 8);
      (pDVar8->_has_bits_).has_bits_[0] = uVar3 | 3;
      pDVar8->end_ = iVar2;
      lVar11 = lVar11 + 1;
    } while (lVar11 < *(int *)(this + 0x80));
  }
  if (0 < *(int *)(this + 0x84)) {
    lVar11 = 0;
    do {
      DescriptorProto::add_reserved_name(proto,*(string **)(*(long *)(this + 0x60) + lVar11 * 8));
      lVar11 = lVar11 + 1;
    } while (lVar11 < *(int *)(this + 0x84));
  }
  pMVar10 = *(MessageOptions **)(this + 0x20);
  pMVar9 = MessageOptions::default_instance();
  if (pMVar10 != pMVar9) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 2;
    pMVar10 = proto->options_;
    if (pMVar10 == (MessageOptions *)0x0) {
      pAVar13 = (Arena *)(proto->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         .ptr_;
      if (((ulong)pAVar13 & 1) != 0) {
        pAVar13 = *(Arena **)(((ulong)pAVar13 & 0xfffffffffffffffe) + 0x18);
      }
      pMVar10 = Arena::CreateMaybeMessage<google::protobuf::MessageOptions>(pAVar13);
      proto->options_ = pMVar10;
    }
    MessageOptions::CopyFrom(pMVar10,*(MessageOptions **)(this + 0x20));
    return;
  }
  return;
}

Assistant:

void Descriptor::CopyTo(DescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < field_count(); i++) {
    field(i)->CopyTo(proto->add_field());
  }
  for (int i = 0; i < oneof_decl_count(); i++) {
    oneof_decl(i)->CopyTo(proto->add_oneof_decl());
  }
  for (int i = 0; i < nested_type_count(); i++) {
    nested_type(i)->CopyTo(proto->add_nested_type());
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->CopyTo(proto->add_enum_type());
  }
  for (int i = 0; i < extension_range_count(); i++) {
    extension_range(i)->CopyTo(proto->add_extension_range());
  }
  for (int i = 0; i < extension_count(); i++) {
    extension(i)->CopyTo(proto->add_extension());
  }
  for (int i = 0; i < reserved_range_count(); i++) {
    DescriptorProto::ReservedRange* range = proto->add_reserved_range();
    range->set_start(reserved_range(i)->start);
    range->set_end(reserved_range(i)->end);
  }
  for (int i = 0; i < reserved_name_count(); i++) {
    proto->add_reserved_name(reserved_name(i));
  }

  if (&options() != &MessageOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}